

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple_shooting_cgmres.cpp
# Opt level: O1

void __thiscall
MultipleShootingCGMRES::initSolution
          (MultipleShootingCGMRES *this,double initial_time,VectorXd *initial_state_vec,
          VectorXd *initial_guess_input_vec,double convergence_radius,int max_iteration)

{
  double *pdVar1;
  double *pdVar2;
  undefined8 *puVar3;
  double *pdVar4;
  double dVar5;
  undefined8 uVar6;
  _func_int *p_Var7;
  undefined8 uVar8;
  int iVar9;
  void *pvVar10;
  _func_int **pp_Var11;
  undefined8 *puVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  char *pcVar16;
  SrcEvaluatorType srcEvaluator;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  Index index;
  ulong uVar20;
  Index index_1;
  ulong uVar21;
  long lVar22;
  SrcEvaluatorType srcEvaluator_1;
  ActualDstType actualDst_1;
  Index outer_stride;
  VectorXd initial_control_input_and_constraints_vec;
  InitCGMRES initializer;
  assign_op<double,_double> local_1d9;
  void *local_1d8;
  ulong uStack_1d0;
  _func_int **local_1c0;
  undefined1 local_1b8 [16];
  scalar_constant_op<double> local_1a8;
  double local_1a0;
  ulong local_198;
  double *local_190;
  void *local_188;
  ulong uStack_180;
  InitCGMRES local_170;
  void *local_48;
  ulong uStack_40;
  
  local_1d8 = (void *)0x0;
  uStack_1d0 = 0;
  iVar9 = this->dim_control_input_and_constraints_;
  uVar17 = (ulong)iVar9;
  local_190 = (double *)convergence_radius;
  if (-1 < (long)uVar17) {
    pvVar10 = local_1d8;
    local_1a0 = initial_time;
    if (uVar17 != 0) {
      free((void *)0x0);
      if (iVar9 == 0) {
        local_1d8 = (void *)0x0;
        pvVar10 = local_1d8;
      }
      else {
        pvVar10 = malloc(uVar17 * 8);
        if (iVar9 != 1 && ((ulong)pvVar10 & 0xf) != 0) goto LAB_0010de4f;
        if (pvVar10 == (void *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ios::widen;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
    }
    local_1d8 = pvVar10;
    iVar9 = this->dim_control_input_and_constraints_;
    uVar18 = (ulong)iVar9;
    uStack_1d0 = uVar17;
    if ((long)uVar18 < 0) goto LAB_0010de11;
    if (iVar9 == 0) {
      pp_Var11 = (_func_int **)0x0;
    }
    else {
      pp_Var11 = (_func_int **)malloc(uVar18 * 8);
      if (iVar9 != 1 && ((ulong)pp_Var11 & 0xf) != 0) goto LAB_0010de4f;
      if (pp_Var11 == (_func_int **)0x0) {
        puVar12 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar12 = std::ios::widen;
        __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    iVar9 = this->dim_state_;
    uVar17 = (ulong)iVar9;
    if (-1 < (long)uVar17) {
      local_1c0 = pp_Var11;
      local_198 = uVar18;
      if (iVar9 == 0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = malloc(uVar17 * 8);
        if (iVar9 != 1 && ((ulong)pvVar10 & 0xf) != 0) {
LAB_0010de4f:
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                        "void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pvVar10 == (void *)0x0) {
          puVar12 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar12 = std::ios::widen;
          __cxa_throw(puVar12,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
      }
      InitCGMRES::InitCGMRES(&local_170,this->model_,this->difference_increment_,this->dim_krylov_);
      this->initial_time_ = local_1a0;
      local_188 = local_1d8;
      uStack_180 = uStack_1d0;
      if (-1 < (long)uStack_1d0 || local_1d8 == (void *)0x0) {
        InitCGMRES::solve0stepNOCP
                  (&local_170,local_1a0,initial_state_vec,initial_guess_input_vec,(double)local_190,
                   max_iteration,
                   (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *)
                   &local_188);
        local_48 = pvVar10;
        uStack_40 = uVar17;
        NMPCModel::phixFunc(&this->model_,local_1a0,initial_state_vec,
                            (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                             *)&local_48);
        if (0 < this->horizon_division_num_) {
          lVar13 = 0;
          lVar15 = 0;
          do {
            uVar14 = this->dim_control_input_and_constraints_;
            uVar18 = (ulong)(int)uVar14;
            pdVar4 = (this->control_input_and_constraints_seq_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            if (pdVar4 != (double *)0x0 && (long)uVar18 < 0) goto LAB_0010dd9d;
            iVar9 = (int)lVar15;
            uVar19 = uVar14 * iVar9;
            if (((int)(uVar19 | uVar14) < 0) ||
               ((long)((this->control_input_and_constraints_seq_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows - uVar18) < (long)(int)uVar19)) goto LAB_0010dd67;
            if (uStack_1d0 != uVar18) goto LAB_0010dd86;
            uVar20 = uVar18;
            if ((((ulong)(pdVar4 + (int)uVar19) & 7) == 0) &&
               (uVar20 = (ulong)((uint)((ulong)(pdVar4 + (int)uVar19) >> 3) & 1),
               (long)uVar18 <= (long)uVar20)) {
              uVar20 = uVar18;
            }
            if (0 < (long)uVar20) {
              uVar21 = 0;
              do {
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar21] =
                     *(double *)((long)local_1d8 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            lVar22 = uVar18 - uVar20;
            uVar21 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
            if (1 < lVar22) {
              do {
                pdVar1 = (double *)((long)local_1d8 + uVar20 * 8);
                dVar5 = pdVar1[1];
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar20] = *pdVar1;
                (pdVar4 + (long)(int)(uVar14 * iVar9) + uVar20)[1] = dVar5;
                uVar20 = uVar20 + 2;
              } while ((long)uVar20 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar18) {
              do {
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar21] =
                     *(double *)((long)local_1d8 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar18 != uVar21);
            }
            pdVar4 = (this->state_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
            uVar18 = (this->state_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if ((long)uVar18 < 0 && pdVar4 != (double *)0x0) {
LAB_0010ddf2:
              pcVar16 = 
              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
              ;
              goto LAB_0010de07;
            }
            if ((this->state_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols <= lVar15) {
LAB_0010ddd3:
              __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                            "Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                           );
            }
            if (uVar18 != (initial_state_vec->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_rows) {
LAB_0010ddb4:
              pcVar16 = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>, -1, 1, true>]"
              ;
              goto LAB_0010ddc9;
            }
            uVar20 = uVar18;
            if ((((ulong)(pdVar4 + uVar18 * lVar15) & 7) == 0) &&
               (uVar20 = (ulong)((uint)((ulong)(pdVar4 + uVar18 * lVar15) >> 3) & 1),
               (long)uVar18 <= (long)uVar20)) {
              uVar20 = uVar18;
            }
            pdVar1 = (initial_state_vec->
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                     m_data;
            if (0 < (long)uVar20) {
              uVar21 = 0;
              do {
                *(double *)((long)pdVar4 + uVar21 * 8 + uVar18 * lVar13) = pdVar1[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            lVar22 = uVar18 - uVar20;
            uVar21 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
            if (1 < lVar22) {
              do {
                dVar5 = (pdVar1 + uVar20)[1];
                pdVar2 = (double *)((long)pdVar4 + uVar20 * 8 + uVar18 * lVar13);
                *pdVar2 = pdVar1[uVar20];
                pdVar2[1] = dVar5;
                uVar20 = uVar20 + 2;
              } while ((long)uVar20 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar18) {
              do {
                *(double *)((long)pdVar4 + uVar21 * 8 + uVar18 * lVar13) = pdVar1[uVar21];
                uVar21 = uVar21 + 1;
              } while (uVar18 != uVar21);
            }
            pdVar4 = (this->lambda_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_data;
            uVar18 = (this->lambda_mat_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
            if ((long)uVar18 < 0 && pdVar4 != (double *)0x0) goto LAB_0010ddf2;
            if ((this->lambda_mat_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                .m_storage.m_cols <= lVar15) goto LAB_0010ddd3;
            if (uVar18 != uVar17) goto LAB_0010ddb4;
            uVar20 = uVar18;
            if ((((ulong)(pdVar4 + uVar18 * lVar15) & 7) == 0) &&
               (uVar20 = (ulong)((uint)((ulong)(pdVar4 + uVar18 * lVar15) >> 3) & 1),
               (long)uVar18 <= (long)uVar20)) {
              uVar20 = uVar18;
            }
            if (0 < (long)uVar20) {
              uVar21 = 0;
              do {
                *(undefined8 *)((long)pdVar4 + uVar21 * 8 + uVar18 * lVar13) =
                     *(undefined8 *)((long)pvVar10 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar20 != uVar21);
            }
            lVar22 = uVar18 - uVar20;
            uVar21 = (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU) + uVar20;
            if (1 < lVar22) {
              do {
                puVar12 = (undefined8 *)((long)pvVar10 + uVar20 * 8);
                uVar6 = puVar12[1];
                puVar3 = (undefined8 *)((long)pdVar4 + uVar20 * 8 + uVar18 * lVar13);
                *puVar3 = *puVar12;
                puVar3[1] = uVar6;
                uVar20 = uVar20 + 2;
              } while ((long)uVar20 < (long)uVar21);
            }
            if ((long)uVar21 < (long)uVar18) {
              do {
                *(undefined8 *)((long)pdVar4 + uVar21 * 8 + uVar18 * lVar13) =
                     *(undefined8 *)((long)pvVar10 + uVar21 * 8);
                uVar21 = uVar21 + 1;
              } while (uVar18 != uVar21);
            }
            lVar15 = lVar15 + 1;
            lVar13 = lVar13 + 8;
          } while (lVar15 < this->horizon_division_num_);
        }
        InitCGMRES::getOptimalityErrorVec
                  ((InitCGMRES *)local_1b8,local_1a0,(VectorXd *)&local_170,initial_state_vec);
        uVar8 = local_1b8._8_8_;
        uVar6 = local_1b8._0_8_;
        local_1b8._0_8_ = local_1c0;
        local_1b8._8_8_ = local_198;
        free(local_1c0);
        uVar14 = this->horizon_division_num_;
        if (0 < (int)uVar14) {
          iVar9 = 0;
          do {
            uVar14 = this->dim_control_input_and_constraints_;
            uVar17 = (ulong)(int)uVar14;
            pdVar4 = (this->control_input_and_constraints_error_seq_).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
            ;
            if (pdVar4 != (double *)0x0 && (long)uVar17 < 0) goto LAB_0010dd9d;
            uVar19 = uVar14 * iVar9;
            if (((int)(uVar19 | uVar14) < 0) ||
               ((long)((this->control_input_and_constraints_error_seq_).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows - uVar17) < (long)(int)uVar19)) {
LAB_0010dd67:
              __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                            ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                            "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                           );
            }
            if (uVar8 != uVar17) {
LAB_0010dd86:
              pcVar16 = 
              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>]"
              ;
LAB_0010ddc9:
              __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                            ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,pcVar16);
            }
            uVar18 = uVar17;
            if ((((ulong)(pdVar4 + (int)uVar19) & 7) == 0) &&
               (uVar18 = (ulong)((uint)((ulong)(pdVar4 + (int)uVar19) >> 3) & 1),
               (long)uVar17 <= (long)uVar18)) {
              uVar18 = uVar17;
            }
            if (0 < (long)uVar18) {
              uVar20 = 0;
              do {
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar20] =
                     (double)*(_func_int **)(uVar6 + uVar20 * 8);
                uVar20 = uVar20 + 1;
              } while (uVar18 != uVar20);
            }
            lVar13 = uVar17 - uVar18;
            uVar20 = (lVar13 - (lVar13 >> 0x3f) & 0xfffffffffffffffeU) + uVar18;
            if (1 < lVar13) {
              do {
                pp_Var11 = (_func_int **)(uVar6 + uVar18 * 8);
                p_Var7 = pp_Var11[1];
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar18] = (double)*pp_Var11;
                (pdVar4 + (long)(int)(uVar14 * iVar9) + uVar18)[1] = (double)p_Var7;
                uVar18 = uVar18 + 2;
              } while ((long)uVar18 < (long)uVar20);
            }
            if ((long)uVar20 < (long)uVar17) {
              do {
                pdVar4[(long)(int)(uVar14 * iVar9) + uVar20] =
                     (double)*(_func_int **)(uVar6 + uVar20 * 8);
                uVar20 = uVar20 + 1;
              } while (uVar17 != uVar20);
            }
            iVar9 = iVar9 + 1;
            uVar14 = this->horizon_division_num_;
          } while (iVar9 < (int)uVar14);
        }
        local_1b8._0_8_ = SEXT48(this->dim_state_);
        local_1b8._8_8_ = SEXT48((int)uVar14);
        local_1a8.m_other = 0.0;
        if (-1 < (int)(this->dim_state_ | uVar14)) {
          Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (&this->state_error_mat_,
                     (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                      *)local_1b8,&local_1d9);
          local_1b8._0_8_ = SEXT48(this->dim_state_);
          local_1b8._8_8_ = SEXT48(this->horizon_division_num_);
          local_1a8.m_other = 0.0;
          if (-1 < (this->horizon_division_num_ | this->dim_state_)) {
            Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                      (&this->lambda_error_mat_,
                       (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                        *)local_1b8,&local_1d9);
            free(local_170.error_vec_2_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.error_vec_1_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.error_vec_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 .m_storage.m_data);
            free(local_170.lambda_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.incremented_solution_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.solution_update_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            local_170.super_MatrixFreeGMRES._vptr_MatrixFreeGMRES =
                 (_func_int **)&PTR___cxa_pure_virtual_00120bc8;
            free(local_170.super_MatrixFreeGMRES.g_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.givens_s_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.givens_c_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.b_vec_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.basis_mat_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
            free(local_170.super_MatrixFreeGMRES.hessenberg_mat_.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
            free(pvVar10);
            free((void *)uVar6);
            free(local_1d8);
            return;
          }
        }
        local_1a8.m_other = 0.0;
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      pcVar16 = 
      "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
      ;
      goto LAB_0010de07;
    }
  }
LAB_0010de11:
  __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x130,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
LAB_0010dd9d:
  pcVar16 = 
  "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>, Level = 0]"
  ;
LAB_0010de07:
  __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,pcVar16);
}

Assistant:

void MultipleShootingCGMRES::initSolution(const double initial_time, const Eigen::VectorXd& initial_state_vec, const Eigen::VectorXd& initial_guess_input_vec, const double convergence_radius, const int max_iteration)
{
    Eigen::VectorXd initial_control_input_and_constraints_vec(dim_control_input_and_constraints_), initial_control_input_and_constraints_error(dim_control_input_and_constraints_), initial_lambda_vec(dim_state_);
    InitCGMRES initializer(model_, difference_increment_, dim_krylov_);
    initial_time_ = initial_time;

    // Intialize the solution
    initializer.solve0stepNOCP(initial_time, initial_state_vec, initial_guess_input_vec, convergence_radius, max_iteration, initial_control_input_and_constraints_vec);
    model_.phixFunc(initial_time, initial_state_vec, initial_lambda_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_vec;
        state_mat_.col(i) = initial_state_vec;
        lambda_mat_.col(i) = initial_lambda_vec;
    }

    // Intialize the optimality error.
    initial_control_input_and_constraints_error = initializer.getOptimalityErrorVec(initial_time, initial_state_vec, initial_control_input_and_constraints_vec);
    for(int i=0; i<horizon_division_num_; i++){
        control_input_and_constraints_error_seq_.segment(i*dim_control_input_and_constraints_, dim_control_input_and_constraints_) = initial_control_input_and_constraints_error;
    }
    state_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
    lambda_error_mat_ = Eigen::MatrixXd::Zero(dim_state_, horizon_division_num_);
}